

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

pair<const_unsigned_char_*,_long>
duckdb_snappy::DecompressBranchless<unsigned_long>
          (uint8_t *ip,uint8_t *ip_limit,ptrdiff_t op,unsigned_long op_base,
          ptrdiff_t op_limit_min_slop)

{
  long lVar1;
  uint *puVar2;
  byte bVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  uint *puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  pair<const_unsigned_char_*,_long> pVar15;
  pair<const_unsigned_char_*,_long> pVar16;
  ushort local_38 [4];
  
  if (op_limit_min_slop + -0x40 <= op || (long)ip_limit - (long)ip < 0x83) {
    pVar15.second = op;
    pVar15.first = ip;
    return pVar15;
  }
  uVar9 = (ulong)*ip;
  puVar4 = (uint *)(ip + 1);
  uVar5 = 0;
  do {
    uVar6 = uVar5;
    puVar10 = puVar4;
    bVar14 = true;
    do {
      bVar8 = bVar14;
      lVar1 = uVar9 * 2;
      uVar13 = (ulong)*(short *)((anonymous_namespace)::kLengthMinusOffset + lVar1);
      uVar12 = (ulong)((uint)uVar9 & 3);
      bVar14 = (uVar9 & 3) != 0;
      puVar2 = (uint *)((long)puVar10 + (uVar9 >> 2) + 2);
      puVar4 = (uint *)((long)puVar10 + uVar12 + 1);
      bVar3 = *(byte *)((long)puVar2 + -1);
      if (bVar14) {
        bVar3 = *(byte *)((long)puVar4 + -1);
      }
      uVar9 = (ulong)bVar3;
      if (!bVar14) {
        puVar4 = puVar2;
      }
      uVar5 = uVar13 & 0xff;
      local_38[0] = 0;
      local_38[1] = 0xff;
      local_38[2] = 0xffff;
      local_38[3] = 0;
      uVar11 = uVar13 - ((uint)local_38[uVar12] & *puVar10);
      if (uVar11 == 0 || (long)uVar13 < (long)(ulong)((uint)local_38[uVar12] & *puVar10)) {
        lVar7 = op + uVar6;
        op = lVar7;
        if (((long)((lVar7 - uVar5) + uVar11) < 0) && (uVar12 != 0)) goto LAB_01bd7ef5;
      }
      else {
        lVar7 = uVar6 + op;
        if ((((char)*(short *)((anonymous_namespace)::kLengthMinusOffset + lVar1) < '\0') ||
            ((long)((lVar7 - uVar5) + uVar11) < 0)) || (uVar5 == uVar11)) goto LAB_01bd7ef5;
        op = uVar5 + lVar7;
        uVar5 = 0;
      }
      uVar6 = uVar5;
      puVar10 = puVar4;
      bVar14 = false;
    } while (bVar8);
    lVar7 = uVar5 + op;
  } while ((puVar4 < ip_limit + -0x81) && (lVar7 < op_limit_min_slop + -0x40));
LAB_01bd7ef5:
  pVar16.first = (uchar *)((long)puVar10 + -1);
  pVar16.second = lVar7;
  return pVar16;
}

Assistant:

std::pair<const uint8_t*, ptrdiff_t> DecompressBranchless(
    const uint8_t* ip, const uint8_t* ip_limit, ptrdiff_t op, T op_base,
    ptrdiff_t op_limit_min_slop) {
  // If deferred_src is invalid point it here.
  uint8_t safe_source[64];
  const void* deferred_src;
  size_t deferred_length;
  ClearDeferred(&deferred_src, &deferred_length, safe_source);

  // We unroll the inner loop twice so we need twice the spare room.
  op_limit_min_slop -= kSlopBytes;
  if (2 * (kSlopBytes + 1) < ip_limit - ip && op < op_limit_min_slop) {
    const uint8_t* const ip_limit_min_slop = ip_limit - 2 * kSlopBytes - 1;
    ip++;
    // ip points just past the tag and we are touching at maximum kSlopBytes
    // in an iteration.
    size_t tag = ip[-1];
#if defined(__clang__) && defined(__aarch64__)
    // Workaround for https://bugs.llvm.org/show_bug.cgi?id=51317
    // when loading 1 byte, clang for aarch64 doesn't realize that it(ldrb)
    // comes with free zero-extension, so clang generates another
    // 'and xn, xm, 0xff' before it use that as the offset. This 'and' is
    // redundant and can be removed by adding this dummy asm, which gives
    // clang a hint that we're doing the zero-extension at the load.
    asm("" ::"r"(tag));
#endif
    do {
      // The throughput is limited by instructions, unrolling the inner loop
      // twice reduces the amount of instructions checking limits and also
      // leads to reduced mov's.

      SNAPPY_PREFETCH(ip + 128);
      for (int i = 0; i < 2; i++) {
        const uint8_t* old_ip = ip;
        assert(tag == ip[-1]);
        // For literals tag_type = 0, hence we will always obtain 0 from
        // ExtractLowBytes. For literals offset will thus be kLiteralOffset.
        ptrdiff_t len_minus_offset = kLengthMinusOffset[tag];
        uint32_t next;
#if defined(__aarch64__)
        size_t tag_type = AdvanceToNextTagARMOptimized(&ip, &tag);
        // We never need more than 16 bits. Doing a Load16 allows the compiler
        // to elide the masking operation in ExtractOffset.
        next = LittleEndian::Load16(old_ip);
#else
        size_t tag_type = AdvanceToNextTagX86Optimized(&ip, &tag);
        next = LittleEndian::Load32(old_ip);
#endif
        size_t len = len_minus_offset & 0xFF;
        ptrdiff_t extracted = ExtractOffset(next, tag_type);
        ptrdiff_t len_min_offset = len_minus_offset - extracted;
        if (SNAPPY_PREDICT_FALSE(len_minus_offset > extracted)) {
          if (SNAPPY_PREDICT_FALSE(len & 0x80)) {
            // Exceptional case (long literal or copy 4).
            // Actually doing the copy here is negatively impacting the main
            // loop due to compiler incorrectly allocating a register for
            // this fallback. Hence we just break.
          break_loop:
            ip = old_ip;
            goto exit;
          }
          // Only copy-1 or copy-2 tags can get here.
          assert(tag_type == 1 || tag_type == 2);
          std::ptrdiff_t delta = (op + deferred_length) + len_min_offset - len;
          // Guard against copies before the buffer start.
          // Execute any deferred MemCopy since we write to dst here.
          MemCopy64(op_base + op, deferred_src, deferred_length);
          op += deferred_length;
          ClearDeferred(&deferred_src, &deferred_length, safe_source);
          if (SNAPPY_PREDICT_FALSE(delta < 0 ||
                                  !Copy64BytesWithPatternExtension(
                                      op_base + op, len - len_min_offset))) {
            goto break_loop;
          }
          // We aren't deferring this copy so add length right away.
          op += len;
          continue;
        }
        std::ptrdiff_t delta = (op + deferred_length) + len_min_offset - len;
        if (SNAPPY_PREDICT_FALSE(delta < 0)) {
          // Due to the spurious offset in literals have this will trigger
          // at the start of a block when op is still smaller than 256.
          if (tag_type != 0) goto break_loop;
          MemCopy64(op_base + op, deferred_src, deferred_length);
          op += deferred_length;
          DeferMemCopy(&deferred_src, &deferred_length, old_ip, len);
          continue;
        }

        // For copies we need to copy from op_base + delta, for literals
        // we need to copy from ip instead of from the stream.
        const void* from =
            tag_type ? reinterpret_cast<void*>(op_base + delta) : old_ip;
        MemCopy64(op_base + op, deferred_src, deferred_length);
        op += deferred_length;
        DeferMemCopy(&deferred_src, &deferred_length, from, len);
      }
    } while (ip < ip_limit_min_slop &&
             static_cast<ptrdiff_t>(op + deferred_length) < op_limit_min_slop);
  exit:
    ip--;
    assert(ip <= ip_limit);
  }
  // If we deferred a copy then we can perform.  If we are up to date then we
  // might not have enough slop bytes and could run past the end.
  if (deferred_length) {
    MemCopy64(op_base + op, deferred_src, deferred_length);
    op += deferred_length;
    ClearDeferred(&deferred_src, &deferred_length, safe_source);
  }
  return {ip, op};
}